

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O2

void __thiscall IndexTree::initFileMap(IndexTree *this)

{
  uint32_t *puVar1;
  
  madvise(this->file_map,this->index_file_size,1);
  puVar1 = (uint32_t *)this->file_map;
  this->node_count = puVar1;
  this->root_node = (int32_t *)(puVar1 + 1);
  this->nodes = (Node *)(puVar1 + 2);
  return;
}

Assistant:

void IndexTree::initFileMap() {
    madvise(file_map, index_file_size, MADV_RANDOM);
    node_count = reinterpret_cast<uint32_t*>(file_map);
    root_node = reinterpret_cast<int32_t*>(node_count + 1);
    nodes = reinterpret_cast<Node*>(root_node + 1);
//    printf("Index file map: %p %p %p\n", node_count, root_node, nodes);
}